

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::Slider::mouseReleaseEvent(Slider *this,QMouseEvent *e)

{
  SubControl SVar1;
  Int IVar2;
  SliderPrivate *pSVar3;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  bool bVar4;
  Int local_1c;
  SubControl oldPressed;
  QMouseEvent *e_local;
  Slider *this_local;
  
  _oldPressed = e;
  e_local = (QMouseEvent *)this;
  pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  __fd = (int)e;
  bVar4 = true;
  __addr = extraout_RDX;
  if (pSVar3->pressedControl != SC_None) {
    local_1c = (Int)QSinglePointEvent::buttons((QSinglePointEvent *)_oldPressed);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    bVar4 = IVar2 != 0;
    __addr = extraout_RDX_00;
  }
  if (bVar4) {
    QEvent::ignore((QEvent *)_oldPressed);
  }
  else {
    QEvent::accept((QEvent *)_oldPressed,__fd,__addr,(socklen_t *)pSVar3);
    pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
             ::operator->(&this->d);
    SVar1 = pSVar3->pressedControl;
    pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
             ::operator->(&this->d);
    pSVar3->pressedControl = SC_None;
    QAbstractSlider::setRepeatAction((SliderAction)this,0,500);
    if (SVar1 == SC_ComboBoxEditField) {
      QAbstractSlider::setSliderDown(SUB81(this,0));
    }
    QWidget::update();
  }
  return;
}

Assistant:

void
Slider::mouseReleaseEvent( QMouseEvent * e )
{
	if( d->pressedControl == QStyle::SC_None || e->buttons() )
	{
		e->ignore();
		return;
	}

	e->accept();
	QStyle::SubControl oldPressed = QStyle::SubControl( d->pressedControl );
	d->pressedControl = QStyle::SC_None;
	setRepeatAction( SliderNoAction );
	if( oldPressed == QStyle::SC_SliderHandle )
		setSliderDown( false );
	update();
}